

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool_tests.cpp
# Opt level: O1

void __thiscall mempool_tests::MempoolRemoveTest::test_method(MempoolRemoveTest *this)

{
  long lVar1;
  pointer pCVar2;
  undefined8 *puVar3;
  CTxMemPool *this_00;
  unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *puVar4;
  unsigned_long uVar5;
  uint uVar6;
  long lVar7;
  vector<CTxOut,_std::allocator<CTxOut>_> *pvVar8;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar9;
  char *pcVar10;
  iterator pvVar11;
  iterator in_R9;
  iterator pvVar12;
  CMutableTransaction *this_01;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  undefined1 *local_4f8;
  undefined1 *local_4f0;
  char *local_4e8;
  char *local_4e0;
  undefined1 *local_4d8;
  undefined1 *local_4d0;
  char *local_4c8;
  char *local_4c0;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  char *local_4a8;
  char *local_4a0;
  undefined1 *local_498;
  undefined1 *local_490;
  char *local_488;
  char *local_480;
  undefined1 *local_478;
  undefined1 *local_470;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  char *local_428;
  char *local_420;
  uint local_414;
  undefined1 *local_410;
  undefined1 *local_408;
  char *local_400;
  char *local_3f8;
  unsigned_long local_3f0;
  lazy_ostream local_3e8;
  undefined1 *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  uint poolSize;
  CMutableTransaction txParent;
  TestMemPoolEntryHelper entry;
  uint *local_320;
  undefined **local_318;
  undefined1 local_310;
  undefined1 *local_308;
  uint **local_300;
  undefined1 local_2f8 [8];
  char *local_2f0 [2];
  assertion_result local_2e0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  undefined1 local_2a8 [16];
  undefined1 local_298 [8];
  vector<CTxOut,_std::allocator<CTxOut>_> vStack_290;
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  local_268 [4];
  CMutableTransaction txGrandChild [3];
  CMutableTransaction txChild [3];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  entry.nFee = 0;
  entry.time.__d.__r = (duration)0;
  entry.nHeight = 1;
  entry.m_sequence = 0;
  entry.spendsCoinbase = false;
  entry.sigOpCost = 4;
  entry.lp.height = 0;
  entry.lp.time = 0;
  entry.lp.maxInputBlock = (CBlockIndex *)0x0;
  CMutableTransaction::CMutableTransaction(&txParent);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&txParent.vin,1);
  local_298 = (undefined1  [8])0x0;
  vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_2a8._0_8_ = (char *)0x0;
  local_2a8._8_8_ = 0;
  txChild[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ = 0x5b;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_2a8,(iterator)local_2a8,
             (uchar *)txChild);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((txParent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_2a8);
  if (0x1c < vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start._4_4_) {
    free((void *)local_2a8._0_8_);
    local_2a8._0_8_ = (char *)0x0;
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&txParent.vout,3);
  lVar7 = 8;
  this_01 = txChild;
  do {
    local_298 = (undefined1  [8])0x0;
    vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_2a8._0_8_ = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)0x0;
    local_2a8._8_8_ = 0;
    txChild[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data
    ._M_start._0_1_ = 0x5b;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_2a8,(iterator)local_2a8,
               (uchar *)this_01);
    uVar6 = vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start._4_4_ - 0x1d;
    if (vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
        super__Vector_impl_data._M_start._4_4_ < 0x1d) {
      uVar6 = vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start._4_4_;
    }
    ppVar9 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_2a8._0_8_;
    if (vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
        super__Vector_impl_data._M_start._4_4_ < 0x1d) {
      ppVar9 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_2a8;
    }
    txChild[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data
    ._M_start._0_1_ = 0x87;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_2a8,
               (uchar *)((long)&ppVar9->_union + (long)(int)uVar6),(uchar *)this_01);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
               ((long)&(txParent.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                        super__Vector_impl_data._M_start)->nValue + lVar7),
               (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_2a8);
    if (0x1c < vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start._4_4_) {
      free((void *)local_2a8._0_8_);
      local_2a8._0_8_ = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)0x0;
    }
    *(undefined8 *)
     ((long)txParent.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start + lVar7 + -8) = 33000;
    lVar7 = lVar7 + 0x28;
  } while (lVar7 != 0x80);
  lVar7 = 0;
  do {
    CMutableTransaction::CMutableTransaction
              ((CMutableTransaction *)
               ((long)&txChild[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar7));
    lVar7 = lVar7 + 0x38;
  } while (lVar7 != 0xa8);
  lVar7 = 0;
  do {
    std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&this_01->vin,1);
    local_298 = (undefined1  [8])0x0;
    vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_2a8._0_8_ = (char *)0x0;
    local_2a8._8_8_ = 0;
    txGrandChild[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = 0x5b;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_2a8,(iterator)local_2a8,
               (uchar *)txGrandChild);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&(((this_01->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,
               (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_2a8);
    if (0x1c < vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start._4_4_) {
      free((void *)local_2a8._0_8_);
      local_2a8._0_8_ = (char *)0x0;
    }
    CMutableTransaction::GetHash((Txid *)local_2a8,&txParent);
    pCVar2 = (this_01->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start;
    *(undefined1 (*) [8])((long)&(pCVar2->prevout).hash + 0x10) = local_298;
    *(pointer *)((long)&(pCVar2->prevout).hash + 0x18) =
         vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
         super__Vector_impl_data._M_start;
    *(undefined8 *)&(pCVar2->prevout).hash = local_2a8._0_8_;
    *(undefined8 *)((long)&(pCVar2->prevout).hash + 8) = local_2a8._8_8_;
    (((this_01->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).n = (uint32_t)lVar7;
    std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&this_01->vout,1);
    local_298 = (undefined1  [8])0x0;
    vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_2a8._0_8_ = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)0x0;
    local_2a8._8_8_ = 0;
    txGrandChild[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = 0x5b;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_2a8,(iterator)local_2a8,
               (uchar *)txGrandChild);
    uVar6 = vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start._4_4_ - 0x1d;
    if (vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
        super__Vector_impl_data._M_start._4_4_ < 0x1d) {
      uVar6 = vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start._4_4_;
    }
    ppVar9 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_2a8._0_8_;
    if (vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
        super__Vector_impl_data._M_start._4_4_ < 0x1d) {
      ppVar9 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_2a8;
    }
    txGrandChild[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = 0x87;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_2a8,
               (uchar *)((long)&ppVar9->_union + (long)(int)uVar6),(uchar *)txGrandChild);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&(((this_01->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
               (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_2a8);
    if (0x1c < vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start._4_4_) {
      free((void *)local_2a8._0_8_);
      local_2a8._0_8_ = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)0x0;
    }
    ((this_01->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
     super__Vector_impl_data._M_start)->nValue = 11000;
    lVar7 = lVar7 + 1;
    this_01 = this_01 + 1;
  } while (lVar7 != 3);
  lVar7 = 0;
  do {
    CMutableTransaction::CMutableTransaction
              ((CMutableTransaction *)
               ((long)&txGrandChild[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                       .super__Vector_impl_data._M_start + lVar7));
    lVar7 = lVar7 + 0x38;
  } while (lVar7 != 0xa8);
  lVar7 = 0;
  do {
    std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)
               ((long)&txGrandChild[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                       .super__Vector_impl_data._M_start + lVar7),1);
    local_298 = (undefined1  [8])0x0;
    vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_2a8._0_8_ = (char *)0x0;
    local_2a8._8_8_ = 0;
    local_318 = (undefined **)CONCAT71(local_318._1_7_,0x5b);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_2a8,(iterator)local_2a8,
               (uchar *)&local_318);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
               (*(long *)((long)&txGrandChild[0].vin.
                                 super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                 super__Vector_impl_data._M_start + lVar7) + 0x28),
               (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_2a8);
    if (0x1c < vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start._4_4_) {
      free((void *)local_2a8._0_8_);
      local_2a8._0_8_ = (char *)0x0;
    }
    CMutableTransaction::GetHash
              ((Txid *)local_2a8,
               (CMutableTransaction *)
               ((long)&txChild[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar7));
    puVar3 = *(undefined8 **)
              ((long)&txGrandChild[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar7);
    puVar3[2] = local_298;
    puVar3[3] = vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start;
    *puVar3 = local_2a8._0_8_;
    puVar3[1] = local_2a8._8_8_;
    *(undefined4 *)
     (*(long *)((long)&txGrandChild[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                       .super__Vector_impl_data._M_start + lVar7) + 0x20) = 0;
    pvVar8 = (vector<CTxOut,_std::allocator<CTxOut>_> *)
             ((long)&txGrandChild[0].vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar7);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(pvVar8,1);
    local_298 = (undefined1  [8])0x0;
    vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_2a8._0_8_ = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)0x0;
    local_2a8._8_8_ = 0;
    local_318._0_1_ = 0x5b;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_2a8,(iterator)local_2a8,
               (uchar *)&local_318);
    uVar6 = vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start._4_4_ - 0x1d;
    if (vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
        super__Vector_impl_data._M_start._4_4_ < 0x1d) {
      uVar6 = vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start._4_4_;
    }
    ppVar9 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_2a8._0_8_;
    if (vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
        super__Vector_impl_data._M_start._4_4_ < 0x1d) {
      ppVar9 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_2a8;
    }
    local_318 = (undefined **)CONCAT71(local_318._1_7_,0x87);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_2a8,
               (uchar *)((long)&ppVar9->_union + (long)(int)uVar6),(uchar *)&local_318);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&(((pvVar8->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
                  super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
               (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_2a8);
    if (0x1c < vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start._4_4_) {
      free((void *)local_2a8._0_8_);
      local_2a8._0_8_ = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)0x0;
    }
    **(undefined8 **)
      ((long)&txGrandChild[0].vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start + lVar7) = 11000;
    lVar7 = lVar7 + 0x38;
  } while (lVar7 != 0xa8);
  pcVar10 = "m_node.mempool";
  puVar4 = inline_assertion_check<true,std::unique_ptr<CTxMemPool,std::default_delete<CTxMemPool>>&>
                     (&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
                       super_BasicTestingSetup.m_node.mempool,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp"
                      ,0x42,"test_method","m_node.mempool");
  this_00 = (puVar4->_M_t).super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
            super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  criticalblock1.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock1.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock1.super_unique_lock);
  criticalblock2.super_unique_lock._M_device = &(this_00->cs).super_recursive_mutex;
  criticalblock2.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock2.super_unique_lock);
  uVar5 = CTxMemPool::size(this_00);
  poolSize = (uint)uVar5;
  CTransaction::CTransaction((CTransaction *)local_2a8,&txParent);
  CTxMemPool::removeRecursive(this_00,(CTransaction *)local_2a8,REPLACED);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&vStack_290);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_2a8);
  local_3b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x48;
  file.m_begin = (iterator)&local_3b8;
  msg.m_end = in_R9;
  msg.m_begin = pcVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_3c8,msg);
  local_3e8.m_empty = false;
  local_3e8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_3d8 = boost::unit_test::lazy_ostream::inst;
  local_3d0 = "";
  local_3f0 = CTxMemPool::size(this_00);
  local_2f8 = (undefined1  [8])&local_3f0;
  local_320 = &poolSize;
  local_2e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_3f0 == poolSize);
  local_2e0.m_message.px = (element_type *)0x0;
  local_2e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2f0[0] = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_2f0[1] = (char *)((long)
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp"
                         + 0x5f);
  vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_2f8;
  local_2a8._8_8_ = local_2a8._8_8_ & 0xffffffffffffff00;
  local_2a8._0_8_ = &PTR__lazy_ostream_013d3cf0;
  local_298 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
  local_300 = &local_320;
  local_310 = 0;
  local_318 = &PTR__lazy_ostream_013d3d30;
  local_308 = boost::unit_test::lazy_ostream::inst;
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_2e0,&local_3e8,1,2,REQUIRE,0xeccf2c,(size_t)local_2f0,0x48,
             (vector<CTxIn,_std::allocator<CTxIn>_> *)local_2a8,"poolSize",&local_318);
  boost::detail::shared_count::~shared_count(&local_2e0.m_message.pn);
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)local_2a8,&entry,&txParent);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_2a8);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree(local_268);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)local_298);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_);
  }
  uVar5 = CTxMemPool::size(this_00);
  poolSize = (uint)uVar5;
  CTransaction::CTransaction((CTransaction *)local_2a8,&txParent);
  CTxMemPool::removeRecursive(this_00,(CTransaction *)local_2a8,REPLACED);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&vStack_290);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_2a8);
  local_400 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_3f8 = "";
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x4e;
  file_00.m_begin = (iterator)&local_400;
  msg_00.m_end = pvVar12;
  msg_00.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_410,
             msg_00);
  local_3e8.m_empty = false;
  local_3e8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_3d8 = boost::unit_test::lazy_ostream::inst;
  local_3d0 = "";
  local_3f0 = CTxMemPool::size(this_00);
  local_414 = poolSize - 1;
  local_320 = &local_414;
  local_2e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_3f0 == local_414);
  local_2e0.m_message.px = (element_type *)0x0;
  local_2e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2f0[0] = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_2f0[1] = (char *)((long)
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp"
                         + 0x5f);
  local_2f8 = (undefined1  [8])&local_3f0;
  local_2a8._8_8_ = local_2a8._8_8_ & 0xffffffffffffff00;
  local_2a8._0_8_ = &PTR__lazy_ostream_013d3cf0;
  local_298 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
  vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_2f8;
  local_310 = 0;
  local_318 = &PTR__lazy_ostream_013d3d30;
  local_308 = boost::unit_test::lazy_ostream::inst;
  local_300 = &local_320;
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_2e0,&local_3e8,1,2,REQUIRE,0xeccf2c,(size_t)local_2f0,0x4e,
             (vector<CTxIn,_std::allocator<CTxIn>_> *)local_2a8,"poolSize - 1",&local_318);
  boost::detail::shared_count::~shared_count(&local_2e0.m_message.pn);
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)local_2a8,&entry,&txParent);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_2a8);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree(local_268);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)local_298);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_);
  }
  lVar7 = 0;
  do {
    TestMemPoolEntryHelper::FromTx
              ((CTxMemPoolEntry *)local_2a8,&entry,
               (CMutableTransaction *)
               ((long)&txChild[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar7));
    CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_2a8);
    std::
    _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
    ::~_Rb_tree(local_268);
    std::
    _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
    ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                 *)local_298);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_);
    }
    TestMemPoolEntryHelper::FromTx
              ((CTxMemPoolEntry *)local_2a8,&entry,
               (CMutableTransaction *)
               ((long)&txGrandChild[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                       .super__Vector_impl_data._M_start + lVar7));
    CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_2a8);
    std::
    _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
    ::~_Rb_tree(local_268);
    std::
    _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
    ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                 *)local_298);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_);
    }
    lVar7 = lVar7 + 0x38;
  } while (lVar7 != 0xa8);
  uVar5 = CTxMemPool::size(this_00);
  poolSize = (uint)uVar5;
  CTransaction::CTransaction((CTransaction *)local_2a8,txChild);
  CTxMemPool::removeRecursive(this_00,(CTransaction *)local_2a8,REPLACED);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&vStack_290);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_2a8);
  local_428 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_420 = "";
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x5a;
  file_01.m_begin = (iterator)&local_428;
  msg_01.m_end = pvVar12;
  msg_01.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_438,
             msg_01);
  local_3e8.m_empty = false;
  local_3e8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_3d8 = boost::unit_test::lazy_ostream::inst;
  local_3d0 = "";
  local_3f0 = CTxMemPool::size(this_00);
  local_414 = poolSize - 2;
  local_2e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_3f0 == local_414);
  local_2e0.m_message.px = (element_type *)0x0;
  local_2e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2f0[0] = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_2f0[1] = (char *)((long)
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp"
                         + 0x5f);
  local_2f8 = (undefined1  [8])&local_3f0;
  local_2a8._8_8_ = local_2a8._8_8_ & 0xffffffffffffff00;
  local_2a8._0_8_ = &PTR__lazy_ostream_013d3cf0;
  local_298 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
  vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_2f8;
  local_320 = &local_414;
  local_310 = 0;
  local_318 = &PTR__lazy_ostream_013d3d30;
  local_308 = boost::unit_test::lazy_ostream::inst;
  local_300 = &local_320;
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_2e0,&local_3e8,1,2,REQUIRE,0xeccf2c,(size_t)local_2f0,0x5a,
             (vector<CTxIn,_std::allocator<CTxIn>_> *)local_2a8,"poolSize - 2",&local_318);
  boost::detail::shared_count::~shared_count(&local_2e0.m_message.pn);
  uVar5 = CTxMemPool::size(this_00);
  poolSize = (uint)uVar5;
  CTransaction::CTransaction((CTransaction *)local_2a8,txGrandChild);
  CTxMemPool::removeRecursive(this_00,(CTransaction *)local_2a8,REPLACED);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&vStack_290);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_2a8);
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_440 = "";
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x5e;
  file_02.m_begin = (iterator)&local_448;
  msg_02.m_end = pvVar12;
  msg_02.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_458,
             msg_02);
  local_3e8.m_empty = false;
  local_3e8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_3d8 = boost::unit_test::lazy_ostream::inst;
  local_3d0 = "";
  local_3f0 = CTxMemPool::size(this_00);
  local_2e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_3f0 == poolSize);
  local_2e0.m_message.px = (element_type *)0x0;
  local_2e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2f0[0] = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_2f0[1] = (char *)((long)
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp"
                         + 0x5f);
  local_2f8 = (undefined1  [8])&local_3f0;
  local_2a8._8_8_ = local_2a8._8_8_ & 0xffffffffffffff00;
  local_2a8._0_8_ = &PTR__lazy_ostream_013d3cf0;
  local_298 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
  vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_2f8;
  local_320 = &poolSize;
  local_310 = 0;
  local_318 = &PTR__lazy_ostream_013d3d30;
  local_308 = boost::unit_test::lazy_ostream::inst;
  local_300 = &local_320;
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_2e0,&local_3e8,1,2,REQUIRE,0xeccf2c,(size_t)local_2f0,0x5e,
             (vector<CTxIn,_std::allocator<CTxIn>_> *)local_2a8,"poolSize",&local_318);
  boost::detail::shared_count::~shared_count(&local_2e0.m_message.pn);
  uVar5 = CTxMemPool::size(this_00);
  poolSize = (uint)uVar5;
  CTransaction::CTransaction((CTransaction *)local_2a8,txChild);
  CTxMemPool::removeRecursive(this_00,(CTransaction *)local_2a8,REPLACED);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&vStack_290);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_2a8);
  local_468 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_460 = "";
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x61;
  file_03.m_begin = (iterator)&local_468;
  msg_03.m_end = pvVar12;
  msg_03.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_478,
             msg_03);
  local_3e8.m_empty = false;
  local_3e8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_3d8 = boost::unit_test::lazy_ostream::inst;
  local_3d0 = "";
  local_3f0 = CTxMemPool::size(this_00);
  local_2e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_3f0 == poolSize);
  local_2e0.m_message.px = (element_type *)0x0;
  local_2e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2f0[0] = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_2f0[1] = (char *)((long)
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp"
                         + 0x5f);
  local_2f8 = (undefined1  [8])&local_3f0;
  local_2a8._8_8_ = local_2a8._8_8_ & 0xffffffffffffff00;
  local_2a8._0_8_ = &PTR__lazy_ostream_013d3cf0;
  local_298 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
  vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_2f8;
  local_320 = &poolSize;
  local_310 = 0;
  local_318 = &PTR__lazy_ostream_013d3d30;
  local_308 = boost::unit_test::lazy_ostream::inst;
  local_300 = &local_320;
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_2e0,&local_3e8,1,2,REQUIRE,0xeccf2c,(size_t)local_2f0,0x61,
             (vector<CTxIn,_std::allocator<CTxIn>_> *)local_2a8,"poolSize",&local_318);
  boost::detail::shared_count::~shared_count(&local_2e0.m_message.pn);
  uVar5 = CTxMemPool::size(this_00);
  poolSize = (uint)uVar5;
  CTransaction::CTransaction((CTransaction *)local_2a8,&txParent);
  CTxMemPool::removeRecursive(this_00,(CTransaction *)local_2a8,REPLACED);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&vStack_290);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_2a8);
  local_488 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_480 = "";
  local_498 = &boost::unit_test::basic_cstring<char_const>::null;
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x65;
  file_04.m_begin = (iterator)&local_488;
  msg_04.m_end = pvVar12;
  msg_04.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_498,
             msg_04);
  local_3e8.m_empty = false;
  local_3e8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_3d8 = boost::unit_test::lazy_ostream::inst;
  local_3d0 = "";
  local_3f0 = CTxMemPool::size(this_00);
  local_414 = poolSize - 5;
  local_2e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_3f0 == local_414);
  local_2e0.m_message.px = (element_type *)0x0;
  local_2e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2f0[0] = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_2f0[1] = (char *)((long)
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp"
                         + 0x5f);
  local_2f8 = (undefined1  [8])&local_3f0;
  local_2a8._8_8_ = local_2a8._8_8_ & 0xffffffffffffff00;
  local_2a8._0_8_ = &PTR__lazy_ostream_013d3cf0;
  local_298 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
  vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_2f8;
  local_320 = &local_414;
  local_310 = 0;
  local_318 = &PTR__lazy_ostream_013d3d30;
  local_308 = boost::unit_test::lazy_ostream::inst;
  local_300 = &local_320;
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_2e0,&local_3e8,1,2,REQUIRE,0xeccf2c,(size_t)local_2f0,0x65,
             (vector<CTxIn,_std::allocator<CTxIn>_> *)local_2a8,"poolSize - 5",&local_318);
  boost::detail::shared_count::~shared_count(&local_2e0.m_message.pn);
  local_4a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_4a0 = "";
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x66;
  file_05.m_begin = (iterator)&local_4a8;
  msg_05.m_end = pvVar12;
  msg_05.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_4b8,
             msg_05);
  local_3e8.m_empty = false;
  local_3e8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_3d8 = boost::unit_test::lazy_ostream::inst;
  local_3d0 = "";
  local_3f0 = CTxMemPool::size(this_00);
  local_414 = 0;
  local_2e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_3f0 == 0);
  local_2e0.m_message.px = (element_type *)0x0;
  local_2e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2f0[0] = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_2f0[1] = (char *)((long)
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp"
                         + 0x5f);
  local_2f8 = (undefined1  [8])&local_3f0;
  local_2a8._8_8_ = local_2a8._8_8_ & 0xffffffffffffff00;
  local_2a8._0_8_ = &PTR__lazy_ostream_013d3cf0;
  local_298 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
  vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_2f8;
  local_320 = &local_414;
  local_310 = 0;
  local_318 = &PTR__lazy_ostream_013d3d30;
  local_308 = boost::unit_test::lazy_ostream::inst;
  local_300 = &local_320;
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_2e0,&local_3e8,1,2,REQUIRE,0xeccf2c,(size_t)local_2f0,0x66,
             (vector<CTxIn,_std::allocator<CTxIn>_> *)local_2a8,"0U",&local_318);
  boost::detail::shared_count::~shared_count(&local_2e0.m_message.pn);
  lVar7 = 0;
  do {
    TestMemPoolEntryHelper::FromTx
              ((CTxMemPoolEntry *)local_2a8,&entry,
               (CMutableTransaction *)
               ((long)&txChild[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar7));
    CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_2a8);
    std::
    _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
    ::~_Rb_tree(local_268);
    std::
    _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
    ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                 *)local_298);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_);
    }
    TestMemPoolEntryHelper::FromTx
              ((CTxMemPoolEntry *)local_2a8,&entry,
               (CMutableTransaction *)
               ((long)&txGrandChild[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                       .super__Vector_impl_data._M_start + lVar7));
    CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_2a8);
    std::
    _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
    ::~_Rb_tree(local_268);
    std::
    _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
    ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                 *)local_298);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_);
    }
    lVar7 = lVar7 + 0x38;
  } while (lVar7 != 0xa8);
  uVar5 = CTxMemPool::size(this_00);
  poolSize = (uint)uVar5;
  CTransaction::CTransaction((CTransaction *)local_2a8,&txParent);
  CTxMemPool::removeRecursive(this_00,(CTransaction *)local_2a8,REPLACED);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&vStack_290);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_2a8);
  local_4c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_4c0 = "";
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x72;
  file_06.m_begin = (iterator)&local_4c8;
  msg_06.m_end = pvVar12;
  msg_06.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_4d8,
             msg_06);
  local_3e8.m_empty = false;
  local_3e8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_3d8 = boost::unit_test::lazy_ostream::inst;
  local_3d0 = "";
  local_3f0 = CTxMemPool::size(this_00);
  local_414 = poolSize - 6;
  local_2e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_3f0 == local_414);
  local_2e0.m_message.px = (element_type *)0x0;
  local_2e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2f0[0] = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_2f0[1] = (char *)((long)
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp"
                         + 0x5f);
  local_2f8 = (undefined1  [8])&local_3f0;
  local_2a8._8_8_ = local_2a8._8_8_ & 0xffffffffffffff00;
  local_2a8._0_8_ = &PTR__lazy_ostream_013d3cf0;
  local_298 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
  vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_2f8;
  local_320 = &local_414;
  local_310 = 0;
  local_318 = &PTR__lazy_ostream_013d3d30;
  local_308 = boost::unit_test::lazy_ostream::inst;
  local_300 = &local_320;
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_2e0,&local_3e8,1,2,REQUIRE,0xeccf2c,(size_t)local_2f0,0x72,
             (vector<CTxIn,_std::allocator<CTxIn>_> *)local_2a8,"poolSize - 6",&local_318);
  boost::detail::shared_count::~shared_count(&local_2e0.m_message.pn);
  local_4e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_4e0 = "";
  local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x73;
  file_07.m_begin = (iterator)&local_4e8;
  msg_07.m_end = pvVar12;
  msg_07.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_4f8,
             msg_07);
  local_3e8.m_empty = false;
  local_3e8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_3d8 = boost::unit_test::lazy_ostream::inst;
  local_3d0 = "";
  local_3f0 = CTxMemPool::size(this_00);
  local_414 = 0;
  local_2e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_3f0 == 0);
  local_2e0.m_message.px = (element_type *)0x0;
  local_2e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2f0[0] = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_2f0[1] = (char *)((long)
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp"
                         + 0x5f);
  local_2f8 = (undefined1  [8])&local_3f0;
  local_2a8._8_8_ = local_2a8._8_8_ & 0xffffffffffffff00;
  local_2a8._0_8_ = &PTR__lazy_ostream_013d3cf0;
  local_298 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
  vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_2f8;
  local_320 = &local_414;
  local_310 = 0;
  local_318 = &PTR__lazy_ostream_013d3d30;
  local_308 = boost::unit_test::lazy_ostream::inst;
  local_300 = &local_320;
  boost::test_tools::tt_detail::report_assertion
            (&local_2e0,&local_3e8,1,2,REQUIRE,0xeccf2c,(size_t)local_2f0,0x73,
             (vector<CTxIn,_std::allocator<CTxIn>_> *)local_2a8,"0U",&local_318);
  boost::detail::shared_count::~shared_count(&local_2e0.m_message.pn);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock2.super_unique_lock);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock1.super_unique_lock);
  lVar7 = -0xa8;
  pvVar8 = &txGrandChild[2].vout;
  do {
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(pvVar8);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)(pvVar8 + -1));
    pvVar8 = (vector<CTxOut,_std::allocator<CTxOut>_> *)
             &pvVar8[-3].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    lVar7 = lVar7 + 0x38;
  } while (lVar7 != 0);
  lVar7 = -0xa8;
  pvVar8 = &txChild[2].vout;
  do {
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(pvVar8);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)(pvVar8 + -1));
    pvVar8 = (vector<CTxOut,_std::allocator<CTxOut>_> *)
             &pvVar8[-3].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    lVar7 = lVar7 + 0x38;
  } while (lVar7 != 0);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&txParent.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&txParent.vin);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(MempoolRemoveTest)
{
    // Test CTxMemPool::remove functionality

    TestMemPoolEntryHelper entry;
    // Parent transaction with three children,
    // and three grand-children:
    CMutableTransaction txParent;
    txParent.vin.resize(1);
    txParent.vin[0].scriptSig = CScript() << OP_11;
    txParent.vout.resize(3);
    for (int i = 0; i < 3; i++)
    {
        txParent.vout[i].scriptPubKey = CScript() << OP_11 << OP_EQUAL;
        txParent.vout[i].nValue = 33000LL;
    }
    CMutableTransaction txChild[3];
    for (int i = 0; i < 3; i++)
    {
        txChild[i].vin.resize(1);
        txChild[i].vin[0].scriptSig = CScript() << OP_11;
        txChild[i].vin[0].prevout.hash = txParent.GetHash();
        txChild[i].vin[0].prevout.n = i;
        txChild[i].vout.resize(1);
        txChild[i].vout[0].scriptPubKey = CScript() << OP_11 << OP_EQUAL;
        txChild[i].vout[0].nValue = 11000LL;
    }
    CMutableTransaction txGrandChild[3];
    for (int i = 0; i < 3; i++)
    {
        txGrandChild[i].vin.resize(1);
        txGrandChild[i].vin[0].scriptSig = CScript() << OP_11;
        txGrandChild[i].vin[0].prevout.hash = txChild[i].GetHash();
        txGrandChild[i].vin[0].prevout.n = 0;
        txGrandChild[i].vout.resize(1);
        txGrandChild[i].vout[0].scriptPubKey = CScript() << OP_11 << OP_EQUAL;
        txGrandChild[i].vout[0].nValue = 11000LL;
    }


    CTxMemPool& testPool = *Assert(m_node.mempool);
    LOCK2(::cs_main, testPool.cs);

    // Nothing in pool, remove should do nothing:
    unsigned int poolSize = testPool.size();
    testPool.removeRecursive(CTransaction(txParent), REMOVAL_REASON_DUMMY);
    BOOST_CHECK_EQUAL(testPool.size(), poolSize);

    // Just the parent:
    testPool.addUnchecked(entry.FromTx(txParent));
    poolSize = testPool.size();
    testPool.removeRecursive(CTransaction(txParent), REMOVAL_REASON_DUMMY);
    BOOST_CHECK_EQUAL(testPool.size(), poolSize - 1);

    // Parent, children, grandchildren:
    testPool.addUnchecked(entry.FromTx(txParent));
    for (int i = 0; i < 3; i++)
    {
        testPool.addUnchecked(entry.FromTx(txChild[i]));
        testPool.addUnchecked(entry.FromTx(txGrandChild[i]));
    }
    // Remove Child[0], GrandChild[0] should be removed:
    poolSize = testPool.size();
    testPool.removeRecursive(CTransaction(txChild[0]), REMOVAL_REASON_DUMMY);
    BOOST_CHECK_EQUAL(testPool.size(), poolSize - 2);
    // ... make sure grandchild and child are gone:
    poolSize = testPool.size();
    testPool.removeRecursive(CTransaction(txGrandChild[0]), REMOVAL_REASON_DUMMY);
    BOOST_CHECK_EQUAL(testPool.size(), poolSize);
    poolSize = testPool.size();
    testPool.removeRecursive(CTransaction(txChild[0]), REMOVAL_REASON_DUMMY);
    BOOST_CHECK_EQUAL(testPool.size(), poolSize);
    // Remove parent, all children/grandchildren should go:
    poolSize = testPool.size();
    testPool.removeRecursive(CTransaction(txParent), REMOVAL_REASON_DUMMY);
    BOOST_CHECK_EQUAL(testPool.size(), poolSize - 5);
    BOOST_CHECK_EQUAL(testPool.size(), 0U);

    // Add children and grandchildren, but NOT the parent (simulate the parent being in a block)
    for (int i = 0; i < 3; i++)
    {
        testPool.addUnchecked(entry.FromTx(txChild[i]));
        testPool.addUnchecked(entry.FromTx(txGrandChild[i]));
    }
    // Now remove the parent, as might happen if a block-re-org occurs but the parent cannot be
    // put into the mempool (maybe because it is non-standard):
    poolSize = testPool.size();
    testPool.removeRecursive(CTransaction(txParent), REMOVAL_REASON_DUMMY);
    BOOST_CHECK_EQUAL(testPool.size(), poolSize - 6);
    BOOST_CHECK_EQUAL(testPool.size(), 0U);
}